

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O0

void * tommy_trie_inplace_remove_existing
                 (tommy_trie_inplace *trie_inplace,tommy_trie_inplace_node *node)

{
  long lVar1;
  tommy_trie_inplace_node *ptVar2;
  long in_FS_OFFSET;
  tommy_trie_inplace_node **let_ptr;
  tommy_key_t key;
  tommy_trie_inplace_node *ret;
  tommy_trie_inplace_node *node_local;
  tommy_trie_inplace *trie_inplace_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = trie_inplace_bucket_remove
                     (0x1a,trie_inplace->bucket + (node->key >> 0x1a),node,node->key);
  if (ptVar2 != node) {
    __assert_fail("ret == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommytrieinp.c"
                  ,0xf3,
                  "void *tommy_trie_inplace_remove_existing(tommy_trie_inplace *, tommy_trie_inplace_node *)"
                 );
  }
  trie_inplace->count = trie_inplace->count - 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ptVar2->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_trie_inplace_remove_existing(tommy_trie_inplace* trie_inplace, tommy_trie_inplace_node* node)
{
	tommy_trie_inplace_node* ret;
	tommy_key_t key = node->key;
	tommy_trie_inplace_node** let_ptr;

	let_ptr = &trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];

	ret = trie_inplace_bucket_remove(TOMMY_TRIE_INPLACE_BUCKET_SHIFT, let_ptr, node, key);

	/* the element removed must match the one passed */
	assert(ret == node);

	--trie_inplace->count;

	return ret->data;
}